

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llhttp.c
# Opt level: O0

llparse_match_t
llparse__match_sequence_to_lower
          (llhttp__internal_t *s,uchar *p,uchar *endp,uchar *seq,uint32_t seq_len)

{
  byte bVar1;
  llparse_match_t lVar2;
  uchar current;
  uint32_t index;
  uint32_t seq_len_local;
  uchar *seq_local;
  uchar *endp_local;
  uchar *p_local;
  llhttp__internal_t *s_local;
  llparse_match_t res;
  
  index = s->_index;
  p_local = p;
  do {
    if (p_local == endp) {
      s->_index = index;
      res.status = kMatchPause;
LAB_00116589:
      lVar2._4_4_ = 0;
      lVar2.status = res.status;
      lVar2.current = p_local;
      return lVar2;
    }
    if ((*p_local < 0x41) || (0x5a < *p_local)) {
      bVar1 = *p_local;
    }
    else {
      bVar1 = *p_local | 0x20;
    }
    if (bVar1 != seq[index]) {
      res.status = kMatchMismatch;
LAB_00116574:
      s->_index = 0;
      goto LAB_00116589;
    }
    index = index + 1;
    if (index == seq_len) {
      res.status = kMatchComplete;
      goto LAB_00116574;
    }
    p_local = p_local + 1;
  } while( true );
}

Assistant:

static llparse_match_t llparse__match_sequence_to_lower(
    llhttp__internal_t* s, const unsigned char* p,
    const unsigned char* endp,
    const unsigned char* seq, uint32_t seq_len) {
  uint32_t index;
  llparse_match_t res;

  index = s->_index;
  for (; p != endp; p++) {
    unsigned char current;

    current = ((*p) >= 'A' && (*p) <= 'Z' ? (*p | 0x20) : (*p));
    if (current == seq[index]) {
      if (++index == seq_len) {
        res.status = kMatchComplete;
        goto reset;
      }
    } else {
      res.status = kMatchMismatch;
      goto reset;
    }
  }
  s->_index = index;
  res.status = kMatchPause;
  res.current = p;
  return res;
reset:
  s->_index = 0;
  res.current = p;
  return res;
}